

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

void __thiscall session::dispatch(session *this)

{
  buffer *this_00;
  int len;
  int iVar1;
  int iVar2;
  byte *pbVar3;
  _func_int **pp_Var4;
  char *pcVar5;
  byte bVar6;
  undefined8 uVar7;
  long lVar8;
  imanager *piVar9;
  uint uVar10;
  uint uVar11;
  int len_00;
  ulong uVar12;
  
  this_00 = &this->recvbuf_;
  do {
    if ((this->closed_ != false) || (iVar1 = buffer::size(this_00), iVar1 < 1)) goto LAB_00107c1f;
    pbVar3 = (byte *)buffer::data(this_00);
    iVar1 = buffer::size(this_00);
    if (iVar1 < 1 || pbVar3 == (byte *)0x0) {
LAB_00107ab6:
      uVar12 = 0;
      len_00 = -1;
    }
    else {
      uVar12 = (ulong)*pbVar3;
      len_00 = 1;
      if ((char)*pbVar3 < '\0') {
        lVar8 = 1;
        bVar6 = 0;
        uVar10 = 0;
        do {
          if ((uVar12 & 0x40) == 0) {
            uVar12 = (ulong)(((uint)uVar12 & 0x3f) << (bVar6 & 0x1f) | uVar10);
            len_00 = (int)lVar8;
            goto LAB_00107ad2;
          }
          len_00 = 0;
          if (lVar8 - (ulong)(iVar1 - 1) == 1) {
            uVar12 = 0;
            goto LAB_00107ad2;
          }
          uVar11 = pbVar3[lVar8] & 0xffffffc0;
          uVar10 = pbVar3[lVar8] & 0x3f | uVar10 << 6;
          uVar12 = (ulong)((uint)uVar12 << (uVar11 == 0x80));
          lVar8 = lVar8 + 1;
          bVar6 = bVar6 + 5;
        } while (uVar11 == 0x80);
        goto LAB_00107ab6;
      }
    }
LAB_00107ad2:
    if (len_00 < 0) {
      piVar9 = this->manager_;
      uVar10 = (this->super_iobject).netid_;
      pp_Var4 = piVar9->_vptr_imanager;
      uVar7 = 0x4a;
LAB_00107b0e:
      (*pp_Var4[1])(piVar9,(ulong)uVar10,uVar7);
      (*(this->network_->super_inetwork)._vptr_inetwork[5])
                (this->network_,(ulong)(uint)(this->super_iobject).netid_);
      iVar1 = 1;
    }
    else {
      iVar1 = 3;
      if (len_00 != 0) {
        len = (int)uVar12;
        if (len - 0x800001U < 0xff800000) {
          piVar9 = this->manager_;
          uVar10 = (this->super_iobject).netid_;
          pp_Var4 = piVar9->_vptr_imanager;
          uVar7 = 0x5a;
          goto LAB_00107b0e;
        }
        buffer::reserve(this_00,len + len_00);
        iVar2 = buffer::size(this_00);
        if (len + len_00 <= iVar2) {
          buffer::pop_data(this_00,len_00);
          piVar9 = this->manager_;
          uVar10 = (this->super_iobject).netid_;
          pcVar5 = buffer::data(this_00);
          (*piVar9->_vptr_imanager[2])(piVar9,(ulong)uVar10,pcVar5,uVar12);
          buffer::pop_data(this_00,len);
          iVar1 = 0;
        }
      }
    }
  } while (iVar1 == 0);
  if (iVar1 == 1) {
    return;
  }
LAB_00107c1f:
  buffer::trim_data(this_00);
  return;
}

Assistant:

void session::dispatch()
{
    while (!closed_ && recvbuf_.size() > 0)
    {
        int body_len = 0;
        int head_len = decode_head(&body_len, recvbuf_.data(), recvbuf_.size());
        if (head_len < 0)
        {
            on_error(EBADMSG);
            return;
        }

        if (head_len == 0)
        {
            break;
        }

        if (body_len <= 0 || body_len > max_buffer_size)
        {
            on_error(EMSGSIZE);
            return;
        }

        recvbuf_.reserve(head_len + body_len);
        if (recvbuf_.size() < head_len + body_len)
        {
            break;
        }

        recvbuf_.pop_data(head_len);
        manager_->on_package(netid_, recvbuf_.data(), body_len);
        recvbuf_.pop_data(body_len);
    }

    recvbuf_.trim_data();
}